

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  void *flagvalue_02;
  FILE *__s;
  bool bVar4;
  double dVar5;
  int flag;
  SUNContext ctx;
  double local_c8;
  sunrealtype t;
  FILE *local_b8;
  void *arkode_mem;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long nfeLS;
  
  arkode_mem = (void *)0x0;
  flag = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar2 == 0) {
    puts("\nBrusselator ODE test problem:");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff3333333333333,
           0x4008cccccccccccd,0x4008000000000000);
    printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",0x3ff0000000000000,
           0x400c000000000000,0x3ed4f8b588e368f1);
    printf("    reltol = %.1e,  abstol = %.1e\n\n",0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb);
    local_58 = 0x3ff0000000000000;
    uStack_50 = 0x400c000000000000;
    local_48 = 0x3ed4f8b588e368f1;
    flagvalue = (long *)N_VNew_Serial(3,ctx);
    iVar2 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      puVar1 = *(undefined8 **)(*flagvalue + 0x10);
      *puVar1 = 0x3ff3333333333333;
      puVar1[1] = 0x4008cccccccccccd;
      puVar1[2] = 0x4008000000000000;
      flagvalue_00 = (void *)ARKStepCreate(0,0,f,flagvalue,ctx);
      arkode_mem = flagvalue_00;
      iVar2 = check_flag(flagvalue_00,"ARKStepCreate",0);
      if (iVar2 == 0) {
        flag = ARKodeSetUserData(flagvalue_00,&local_58);
        iVar3 = 1;
        iVar2 = check_flag(&flag,"ARKodeSetUserData",1);
        if (iVar2 == 0) {
          flag = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,flagvalue_00);
          iVar3 = 1;
          iVar2 = check_flag(&flag,"ARKodeSStolerances",1);
          if (iVar2 == 0) {
            iVar3 = 1;
            flag = ARKodeSetInterpolantType(flagvalue_00,1);
            iVar2 = check_flag(&flag,"ARKodeSetInterpolantType",1);
            if (iVar2 == 0) {
              iVar3 = 1;
              flag = ARKodeSetDeduceImplicitRhs(flagvalue_00,1);
              iVar2 = check_flag(&flag,"ARKodeSetDeduceImplicitRhs",1);
              if (iVar2 == 0) {
                flagvalue_01 = (void *)SUNDenseMatrix(3,3,ctx);
                iVar2 = check_flag(flagvalue_01,"SUNDenseMatrix",0);
                if (iVar2 == 0) {
                  flagvalue_02 = (void *)SUNLinSol_Dense(flagvalue,flagvalue_01,ctx);
                  iVar2 = check_flag(flagvalue_02,"SUNLinSol_Dense",0);
                  if (iVar2 == 0) {
                    flag = ARKodeSetLinearSolver(flagvalue_00,flagvalue_02,flagvalue_01);
                    iVar3 = 1;
                    iVar2 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                    if (iVar2 == 0) {
                      flag = ARKodeSetJacFn(flagvalue_00,Jac);
                      iVar3 = 1;
                      iVar2 = check_flag(&flag,"ARKodeSetJacFn",1);
                      if (iVar2 == 0) {
                        iVar3 = 1;
                        flag = ARKodeSetAutonomous(flagvalue_00,1);
                        iVar2 = check_flag(&flag,"ARKodeSetAutonomous",1);
                        if (iVar2 == 0) {
                          __s = fopen("solution.txt","w");
                          fwrite("# t u v w\n",10,1,__s);
                          puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                          local_b8 = __s;
                          fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
                          t = 0.0;
                          puts("        t           u           v           w");
                          puts("   -------------------------------------------");
                          puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",0,*puVar1,puVar1[1],puVar1[2])
                          ;
                          iVar2 = 10;
                          local_c8 = 1.0;
                          while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
                            flag = ARKodeEvolve(local_c8,flagvalue_00,flagvalue,&t,1);
                            iVar3 = check_flag(&flag,"ARKodeEvolve",1);
                            if (iVar3 != 0) break;
                            puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                            printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",t,*puVar1,puVar1[1],
                                   puVar1[2]);
                            puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                            fprintf(local_b8," %.16e %.16e %.16e %.16e\n",t,*puVar1,puVar1[1],
                                    puVar1[2]);
                            if (flag < 0) {
                              fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                              break;
                            }
                            dVar5 = local_c8 + 1.0;
                            local_c8 = 10.0;
                            if (dVar5 <= 10.0) {
                              local_c8 = dVar5;
                            }
                          }
                          puts("   -------------------------------------------");
                          fclose(local_b8);
                          flag = ARKodeGetNumSteps(flagvalue_00,&nst);
                          check_flag(&flag,"ARKodeGetNumSteps",1);
                          flag = ARKodeGetNumStepAttempts(flagvalue_00,&nst_a);
                          check_flag(&flag,"ARKodeGetNumStepAttempts",1);
                          flag = ARKStepGetNumRhsEvals(flagvalue_00,&nfe,&nfi);
                          check_flag(&flag,"ARKStepGetNumRhsEvals",1);
                          flag = ARKodeGetNumLinSolvSetups(flagvalue_00,&nsetups);
                          check_flag(&flag,"ARKodeGetNumLinSolvSetups",1);
                          flag = ARKodeGetNumErrTestFails(flagvalue_00,&netf);
                          check_flag(&flag,"ARKodeGetNumErrTestFails",1);
                          flag = ARKodeGetNumStepSolveFails(flagvalue_00,&ncfn);
                          check_flag(&flag,"ARKodeGetNumStepSolveFails",1);
                          flag = ARKodeGetNumNonlinSolvIters(flagvalue_00,&nni);
                          check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                          flag = ARKodeGetNumNonlinSolvConvFails(flagvalue_00,&nnf);
                          check_flag(&flag,"ARKodeGetNumNonlinSolvConvFails",1);
                          flag = ARKodeGetNumJacEvals(flagvalue_00,&nje);
                          check_flag(&flag,"ARKodeGetNumJacEvals",1);
                          flag = ARKodeGetNumLinRhsEvals(flagvalue_00);
                          check_flag(&flag,"ARKodeGetNumLinRhsEvals",1);
                          puts("\nFinal Solver Statistics:");
                          iVar3 = 0;
                          printf("   Internal solver steps = %li (attempted = %li)\n",nst,nst_a);
                          printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                          printf("   Total linear solver setups = %li\n",nsetups);
                          printf("   Total RHS evals for setting up the linear system = %li\n",nfeLS
                                );
                          printf("   Total number of Jacobian evaluations = %li\n",nje);
                          printf("   Total number of Newton iterations = %li\n",nni);
                          printf("   Total number of nonlinear solver convergence failures = %li\n",
                                 nnf);
                          printf("   Total number of error test failures = %li\n",netf);
                          printf("   Total number of failed steps from solver failure = %li\n",ncfn)
                          ;
                          N_VDestroy(flagvalue);
                          ARKodeFree(&arkode_mem);
                          SUNLinSolFree(flagvalue_02);
                          SUNMatDestroy(flagvalue_01);
                          SUNContext_Free(&ctx);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);      /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);       /* time between outputs */
  sunindextype NEQ   = 3;                     /* number of dependent vars. */
  int Nt             = (int)ceil(Tf / dTout); /* number of output times */
  int test           = 2;                     /* test problem to run */
  sunrealtype reltol = 1.0e-6;                /* tolerances */
  sunrealtype abstol = 1.0e-10;
  sunrealtype a, b, ep, u0, v0, w0;

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNMatrix A        = NULL; /* empty matrix for solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  sunrealtype rdata[3];
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* set up the test problem according to the desired test */
  if (test == 1)
  {
    u0 = SUN_RCONST(3.9);
    v0 = SUN_RCONST(1.1);
    w0 = SUN_RCONST(2.8);
    a  = SUN_RCONST(1.2);
    b  = SUN_RCONST(2.5);
    ep = SUN_RCONST(1.0e-5);
  }
  else if (test == 3)
  {
    u0 = SUN_RCONST(3.0);
    v0 = SUN_RCONST(3.0);
    w0 = SUN_RCONST(3.5);
    a  = SUN_RCONST(0.5);
    b  = SUN_RCONST(3.0);
    ep = SUN_RCONST(5.0e-4);
  }
  else
  {
    u0 = SUN_RCONST(1.2);
    v0 = SUN_RCONST(3.1);
    w0 = SUN_RCONST(3.0);
    a  = SUN_RCONST(1.0);
    b  = SUN_RCONST(3.5);
    ep = SUN_RCONST(5.0e-6);
  }

  /* Initial problem output */
  printf("\nBrusselator ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  rdata[0] = a; /* set user data  */
  rdata[1] = b;
  rdata[2] = ep;
  y        = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)rdata); /* Pass rdata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  flag = ARKodeSetInterpolantType(arkode_mem,
                                  ARK_INTERP_LAGRANGE); /* Specify stiff interpolant */
  if (check_flag(&flag, "ARKodeSetInterpolantType", 1)) { return 1; }

  flag = ARKodeSetDeduceImplicitRhs(arkode_mem, 1); /* Avoid eval of f after stage */
  if (check_flag(&flag, "ARKodeSetDeduceImplicitRhs", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }

  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }

  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Signal that this problem does not explicitly depend on time. In this case
     enabling/disabling this option will lead to slightly different results when
     combined with ARKodeSetDeduceImplicitRhs because the implicit method is
     stiffly accurate. The differences are due to reuse of the deduced implicit
     RHS evaluation in the nonlinear residual. */
  flag = ARKodeSetAutonomous(arkode_mem, SUNTRUE);
  if (check_flag(&flag, "ARKodeSetAutonomous", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   -------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   -------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}